

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_1391874::SetPermissions
               (string *filename,mode_t *perms,cmExecutionStatus *status)

{
  Status SVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  SVar1 = cmsys::SystemTools::SetPermissions(filename,*perms,false);
  if (SVar1.Kind_ != Success) {
    std::operator+(&local_40,"Failed to set permissions for ",filename);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  return SVar1.Kind_ == Success;
}

Assistant:

bool SetPermissions(const std::string& filename, const mode_t& perms,
                    cmExecutionStatus& status)
{
  if (!cmSystemTools::SetPermissions(filename, perms)) {
    status.SetError("Failed to set permissions for " + filename);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  return true;
}